

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

uint __thiscall crnlib::symbol_codec::decode_bits(symbol_codec *this,uint num_bits)

{
  uint uVar1;
  uint uVar2;
  
  if (num_bits == 0) {
    uVar2 = 0;
  }
  else {
    if (num_bits < 0x11) {
      uVar2 = get_bits(this,num_bits);
      return uVar2;
    }
    uVar1 = get_bits(this,num_bits - 0x10);
    uVar2 = get_bits(this,0x10);
    uVar2 = uVar1 << 0x10 | uVar2;
  }
  return uVar2;
}

Assistant:

uint symbol_codec::decode_bits(uint num_bits) {
  CRNLIB_ASSERT(m_mode == cDecoding);

  if (!num_bits)
    return 0;

  if (num_bits > 16) {
    uint a = get_bits(num_bits - 16);
    uint b = get_bits(16);

    return (a << 16) | b;
  } else
    return get_bits(num_bits);
}